

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O3

string * __thiscall wabt::Token::to_string_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  TokenType TVar1;
  Enum EVar2;
  char *pcVar3;
  char *pcVar4;
  Info local_58;
  
  TVar1 = this->token_type_;
  if ((ulong)TVar1 < 0x39) {
    local_58.name = GetTokenTypeName::s_names[TVar1];
    goto LAB_00175972;
  }
  if (TVar1 - First_Literal < 3) {
    pcVar3 = (this->field_2).literal_.text._M_str;
    pcVar4 = (this->field_2).text_._M_str;
LAB_00175993:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar4 + (long)pcVar3);
    return __return_storage_ptr__;
  }
  if (TVar1 - AtomicFence < 0x47) {
    Opcode::GetInfo(&local_58,&(this->field_2).opcode_);
    goto LAB_00175972;
  }
  if (TVar1 - AlignEqNat < 6) {
    pcVar3 = (this->field_2).text_._M_str;
    pcVar4 = (char *)(this->field_2).text_._M_len;
    goto LAB_00175993;
  }
  if (2 < TVar1 - First_RefKind) {
    if (TVar1 - First_Type < 4) {
      Type::GetName_abi_cxx11_(__return_storage_ptr__,&(this->field_2).type_);
      return __return_storage_ptr__;
    }
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/token.cc"
                  ,0x55,"std::string wabt::Token::to_string() const");
  }
  EVar2 = (this->field_2).type_.enum_;
  if (EVar2 < ExnRef) {
    if (EVar2 == Array) {
      local_58.name = "array";
      goto LAB_00175972;
    }
    if (EVar2 == Struct) {
      local_58.name = "struct";
      goto LAB_00175972;
    }
  }
  else {
    if (EVar2 == ExnRef) {
      local_58.name = "exn";
      goto LAB_00175972;
    }
    if (EVar2 == FuncRef) {
      local_58.name = "func";
      goto LAB_00175972;
    }
    if (EVar2 == ExternRef) {
      local_58.name = "extern";
      goto LAB_00175972;
    }
  }
  local_58.name = "<invalid>";
LAB_00175972:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_58.name,(allocator<char> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::to_string() const {
  if (IsTokenTypeBare(token_type_)) {
    return GetTokenTypeName(token_type_);
  } else if (HasLiteral()) {
    return std::string(literal_.text);
  } else if (HasOpcode()) {
    return opcode_.GetName();
  } else if (HasText()) {
    return std::string(text_);
  } else if (IsTokenTypeRefKind(token_type_)) {
    return type_.GetRefKindName();
  } else {
    assert(HasType());
    return type_.GetName();
  }
}